

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O3

void __thiscall google::protobuf::MapValueRef::DeleteData(MapValueRef *this)

{
  undefined8 *puVar1;
  
  switch(this->type_) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    operator_delete(this->data_);
    return;
  case 9:
    puVar1 = (undefined8 *)this->data_;
    if ((puVar1 != (undefined8 *)0x0) && ((undefined8 *)*puVar1 != puVar1 + 2)) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
    return;
  case 10:
    if ((long *)this->data_ != (long *)0x0) {
      (**(code **)(*this->data_ + 8))();
      return;
    }
  }
  return;
}

Assistant:

void DeleteData() {
    switch (type_) {
#define HANDLE_TYPE(CPPTYPE, TYPE)           \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: { \
    delete reinterpret_cast<TYPE*>(data_);   \
    break;                                   \
  }
      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(STRING, std::string);
      HANDLE_TYPE(ENUM, int32);
      HANDLE_TYPE(MESSAGE, Message);
#undef HANDLE_TYPE
    }
  }